

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
Logger::log<signed_char,signed_char>
          (Logger *this,char *id,uint64_t pTime,uint64_t pThread,char *ts,char *ts_1)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t sz_1;
  uint8_t *usedBuffer;
  uint8_t buffer [2048];
  ssize_t rv;
  size_t sz;
  uint8_t local_2058 [4];
  int flen;
  uint8_t logbuff [8192];
  logful_context_t ctx;
  char *ts_local_1;
  char *ts_local;
  uint64_t pThread_local;
  uint64_t pTime_local;
  char *id_local;
  Logger *this_local;
  
  if ((this->mLogful & 1U) != 0) {
    logful_context_t::logful_context_t((logful_context_t *)(logbuff + 0x1ff8));
    iVar1 = sprintf((char *)local_2058,"%lluus %llut ",pTime,pThread);
    sVar2 = logful<signed_char,signed_char>
                      (this,(logful_context_t *)(logbuff + 0x1ff8),local_2058 + iVar1,id,*ts,*ts_1);
    lVar3 = (long)iVar1 + sVar2;
    local_2058[lVar3] = '\n';
    write(1,local_2058,lVar3 + 1);
    logful_context_t::~logful_context_t((logful_context_t *)(logbuff + 0x1ff8));
  }
  usedBuffer = (uint8_t *)(id + -(long)LoggerRef);
  sVar2 = logless<unsigned_long,unsigned_long,signed_char,signed_char>
                    (this,buffer,pTime,pThread,*ts,*ts_1);
  fwrite(&usedBuffer,1,sVar2 + 8,(FILE *)this->mOutputFile);
  return;
}

Assistant:

void log(const char * id, uint64_t pTime, uint64_t pThread, const Ts&... ts)
    {
        if (mLogful)
        {
            logful_context_t ctx;
            uint8_t logbuff[4096*2];
            int flen = std::sprintf((char*)logbuff, "%lluus %llut ", (unsigned long long)pTime, (unsigned long long)pThread);
            size_t sz = flen + 
            logful(ctx, logbuff + flen, id, ts...);
            logbuff[sz++] = '\n';
            [[maybe_unused]] auto rv = ::write(1, logbuff, sz);
        }
        {
            uint8_t buffer[2048];
            uint8_t* usedBuffer = buffer;
            new (usedBuffer) HeaderType(intptr_t(id)-intptr_t(LoggerRef));
            usedBuffer += sizeof(HeaderType);
            size_t sz = logless(usedBuffer, pTime, pThread, ts...) + sizeof(HeaderType);
            std::fwrite((char*)buffer, 1, sz, mOutputFile);
        }
    }